

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triple.cpp
# Opt level: O0

StringRef getObjectFormatTypeName(ObjectFormatType Kind)

{
  undefined1 auStack_68 [4];
  ObjectFormatType Kind_local;
  char *local_58;
  undefined1 *local_50;
  char *local_48;
  undefined1 *local_40;
  char *local_38;
  undefined1 *local_30;
  char *local_28;
  undefined1 *local_20;
  char *local_18;
  undefined1 *local_10;
  
  switch(Kind) {
  case UnknownObjectFormat:
    local_50 = auStack_68;
    local_58 = "";
    strlen("");
    break;
  case COFF:
    local_40 = auStack_68;
    local_48 = "coff";
    strlen("coff");
    break;
  case ELF:
    local_30 = auStack_68;
    local_38 = "elf";
    strlen("elf");
    break;
  case MachO:
    local_20 = auStack_68;
    local_28 = "macho";
    strlen("macho");
    break;
  case Wasm:
    local_10 = auStack_68;
    local_18 = "wasm";
    strlen("wasm");
    break;
  default:
    llvm::llvm_unreachable_internal
              ("unknown object format type",
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/Triple.cpp"
               ,0x268);
  }
  return _auStack_68;
}

Assistant:

static StringRef getObjectFormatTypeName(Triple::ObjectFormatType Kind) {
  switch (Kind) {
  case Triple::UnknownObjectFormat: return "";
  case Triple::COFF: return "coff";
  case Triple::ELF: return "elf";
  case Triple::MachO: return "macho";
  case Triple::Wasm: return "wasm";
  }
  llvm_unreachable("unknown object format type");
}